

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<cmState::SnapshotDataType>::Push
          (cmLinkedTree<cmState::SnapshotDataType> *this,iterator it)

{
  iterator iVar1;
  iterator iVar2;
  SnapshotDataType local_138;
  cmLinkedTree<cmState::SnapshotDataType> *local_48;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_40;
  cmLinkedTree<cmState::SnapshotDataType> *local_30;
  cmLinkedTree<cmState::SnapshotDataType> *this_local;
  iterator it_local;
  
  pcStack_40 = (cmLinkedTree<cmState::SnapshotDataType> *)it.Position;
  local_48 = it.Tree;
  local_138.IncludeDirectoryPosition = 0;
  local_138.CompileDefinitionsPosition = 0;
  local_138.EntryPointCommand.field_2._8_8_ = 0;
  local_138.EntryPointLine = 0;
  local_138.EntryPointCommand._M_string_length = 0;
  local_138.EntryPointCommand.field_2._M_allocated_capacity = 0;
  local_138.Parent.Position = 0;
  local_138.EntryPointCommand._M_dataplus = (_Alloc_hider)0x0;
  local_138.EntryPointCommand._1_7_ = 0;
  local_138.Root.Position = 0;
  local_138.Parent.Tree = (cmLinkedTree<cmDefinitions> *)0x0;
  local_138.Vars.Position = 0;
  local_138.Root.Tree = (cmLinkedTree<cmDefinitions> *)0x0;
  local_138.BuildSystemDirectory.Position = 0;
  local_138.Vars.Tree = (cmLinkedTree<cmDefinitions> *)0x0;
  local_138.ExecutionListFile.Position = 0;
  local_138.BuildSystemDirectory.Tree = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)0x0;
  local_138.SnapshotType = BaseType;
  local_138.Keep = false;
  local_138._85_3_ = 0;
  local_138.ExecutionListFile.Tree =
       (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_138.PolicyScope.Tree = (cmLinkedTree<cmState::PolicyStackEntry> *)0x0;
  local_138.PolicyScope.Position = 0;
  local_138.PolicyRoot.Tree = (cmLinkedTree<cmState::PolicyStackEntry> *)0x0;
  local_138.PolicyRoot.Position = 0;
  local_138.Policies.Tree = (cmLinkedTree<cmState::PolicyStackEntry> *)0x0;
  local_138.Policies.Position = 0;
  local_138.DirectoryParent.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
  local_138.DirectoryParent.Position = 0;
  local_138.ScopeParent.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
  local_138.ScopeParent.Position = 0;
  local_138.CompileOptionsPosition = 0;
  local_30 = this;
  this_local = local_48;
  it_local.Tree = pcStack_40;
  cmState::SnapshotDataType::SnapshotDataType(&local_138);
  iVar2.Position = (PositionType)pcStack_40;
  iVar2.Tree = local_48;
  iVar2 = Push_impl(this,iVar2,&local_138);
  it_local.Position = (PositionType)iVar2.Tree;
  cmState::SnapshotDataType::~SnapshotDataType(&local_138);
  iVar1.Position = iVar2.Position;
  iVar1.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)it_local.Position;
  return iVar1;
}

Assistant:

iterator Push(iterator it)
  {
    return Push_impl(it, T());
  }